

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O1

bool __thiscall
std::less<std::pair<mir::inst::VarId,_mir::inst::Value>_>::operator()
          (less<std::pair<mir::inst::VarId,_mir::inst::Value>_> *this,
          pair<mir::inst::VarId,_mir::inst::Value> *__x,
          pair<mir::inst::VarId,_mir::inst::Value> *__y)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  bool __ret;
  bool local_19;
  anon_class_16_2_9763bfdf_conflict local_18;
  
  uVar1 = (__x->first).id;
  uVar2 = (__y->first).id;
  bVar3 = true;
  if (uVar2 <= uVar1) {
    if (uVar1 <= uVar2) {
      local_18.__lhs = (variant<int,_mir::inst::VarId> *)&(__x->second).field_0x8;
      local_18.__ret = &local_19;
      local_19 = true;
      (*__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:1230:3)_&&,_const_std::variant<int,_mir::inst::VarId>_&>
        ::_S_vtable._M_arr[(long)(char)(__y->second).field_0x18 + 1]._M_data)
                (&local_18,(variant<int,_mir::inst::VarId> *)&(__y->second).field_0x8);
      return local_19;
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool operator<(const VarId& other) const { return id < other.id; }